

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int iso9660_options(archive_write *a,char *key,char *value)

{
  byte bVar1;
  void *pvVar2;
  bool bVar3;
  uint in_EAX;
  int iVar4;
  uint uVar5;
  int iVar6;
  size_t n;
  uint uVar7;
  uint uVar8;
  char *in_R8;
  char *in_R9;
  int num;
  undefined8 uStack_38;
  
  pvVar2 = a->format_data;
  iVar4 = -0x14;
  switch(*key) {
  case 'a':
    iVar4 = strcmp(key,"abstract-file");
    if (iVar4 == 0) {
      iVar4 = get_str_opt(a,(archive_string *)((long)pvVar2 + 0x1a0),0x25,key,value);
      uVar5 = (uint)(iVar4 == 0);
      uVar7 = *(uint *)((long)pvVar2 + 0x10370) & 0xfffffffe;
      goto LAB_004318a6;
    }
    iVar4 = strcmp(key,"application-id");
    if (iVar4 == 0) {
      iVar4 = get_str_opt(a,(archive_string *)((long)pvVar2 + 0x170),0x80,key,value);
      iVar6 = (*(uint *)((long)pvVar2 + 0x10370) & 0xfffffffd) + (uint)(iVar4 == 0) * 2;
      goto LAB_00431818;
    }
    iVar4 = strcmp(key,"allow-vernum");
    if (iVar4 != 0) {
      return -0x14;
    }
    uVar5 = (*(uint *)((long)pvVar2 + 0x10370) & 0xfffffffb) + (uint)(value != (char *)0x0) * 4;
    break;
  case 'b':
    uStack_38._0_4_ = in_EAX;
    iVar6 = strcmp(key,"biblio-file");
    if (iVar6 == 0) {
      iVar4 = get_str_opt(a,(archive_string *)((long)pvVar2 + 0x1b8),0x25,key,value);
      iVar6 = (*(uint *)((long)pvVar2 + 0x10370) & 0xfffffff7) + (uint)(iVar4 == 0) * 8;
LAB_00431818:
      *(int *)((long)pvVar2 + 0x10370) = iVar6;
      return iVar4;
    }
    iVar6 = strcmp(key,"boot");
    if (iVar6 == 0) {
      if (value != (char *)0x0) {
        *(uint *)((long)pvVar2 + 0x10370) = *(uint *)((long)pvVar2 + 0x10370) | 0x10;
        *(undefined8 *)((long)pvVar2 + 0x10330) = 0;
        n = strlen(value);
        archive_strncat((archive_string *)((long)pvVar2 + 0x10328),value,n);
        goto LAB_00431909;
      }
      uVar5 = *(uint *)((long)pvVar2 + 0x10370) & 0xffffffef;
    }
    else {
      iVar6 = strcmp(key,"boot-catalog");
      if (iVar6 == 0) {
        iVar4 = get_str_opt(a,(archive_string *)((long)pvVar2 + 0x10308),0x400,key,value);
        uVar5 = (uint)(iVar4 == 0) << 5;
        uVar7 = *(uint *)((long)pvVar2 + 0x10370) & 0xffffffdf;
        goto LAB_004318a6;
      }
      iVar6 = strcmp(key,"boot-info-table");
      if (iVar6 == 0) {
        uVar5 = (uint)(value != (char *)0x0) << 6;
        uVar7 = *(uint *)((long)pvVar2 + 0x10370) & 0xffffffbf;
        goto LAB_004317dc;
      }
      iVar6 = strcmp(key,"boot-load-seg");
      if (iVar6 == 0) {
        uVar5 = *(uint *)((long)pvVar2 + 0x10370);
        *(uint *)((long)pvVar2 + 0x10370) = uVar5 & 0xffffff7f;
        bVar3 = true;
        if (value != (char *)0x0) {
          if ((*value == '0') && ((byte)(value[1] | 0x20U) == 0x78)) {
            value = value + 2;
          }
          uVar7 = 0;
          bVar1 = *value;
          while (bVar1 != 0) {
            value = (char *)((byte *)value + 1);
            if ((byte)(bVar1 + 0xbf) < 6) {
              uVar8 = bVar1 - 0x37;
            }
            else if ((byte)(bVar1 + 0x9f) < 6) {
              uVar8 = bVar1 - 0x57;
            }
            else {
              if (9 < (byte)(bVar1 - 0x30)) goto LAB_00431a27;
              uVar8 = (uint)(byte)(bVar1 - 0x30);
            }
            uVar7 = uVar7 * 0x10 + uVar8;
            if (0xffff < uVar7) {
              bVar3 = false;
              archive_set_error(&a->archive,-1,"Invalid value(over 0xffff) for option ``%s\'\'",key)
              ;
              iVar4 = -0x1e;
              goto LAB_00431a27;
            }
            bVar1 = *value;
          }
          *(short *)((long)pvVar2 + 0x1036a) = (short)uVar7;
          *(uint *)((long)pvVar2 + 0x10370) = uVar5 | 0x80;
          iVar4 = 0;
          bVar3 = false;
        }
LAB_00431a27:
        if (!bVar3) {
          return iVar4;
        }
LAB_00431a2c:
        archive_set_error(&a->archive,-1,"Invalid value for option ``%s\'\'",key);
        return -0x19;
      }
      iVar4 = strcmp(key,"boot-load-size");
      if (iVar4 == 0) {
        uStack_38 = (ulong)(uint)uStack_38;
        iVar4 = get_num_opt(a,(int *)((long)&uStack_38 + 4),(int)key,(int)value,in_R8,in_R9);
        *(uint *)((long)pvVar2 + 0x10370) =
             *(uint *)((long)pvVar2 + 0x10370) & 0xfffffeff | (uint)(iVar4 == 0) << 8;
        if (iVar4 != 0) {
          return -0x1e;
        }
        *(undefined2 *)((long)pvVar2 + 0x1036c) = uStack_38._4_2_;
        goto LAB_00431909;
      }
      iVar4 = strcmp(key,"boot-type");
      if (iVar4 != 0) {
        return -0x14;
      }
      if (value == (char *)0x0) goto LAB_00431a2c;
      iVar4 = strcmp(value,"no-emulation");
      if (iVar4 == 0) {
        uVar5 = *(uint *)((long)pvVar2 + 0x10370) & 0xfffff9ff | 0x200;
      }
      else {
        iVar4 = strcmp(value,"fd");
        if (iVar4 != 0) {
          iVar4 = strcmp(value,"hard-disk");
          if (iVar4 != 0) goto LAB_00431a2c;
          *(byte *)((long)pvVar2 + 0x10371) = *(byte *)((long)pvVar2 + 0x10371) | 6;
          goto LAB_00431909;
        }
        uVar5 = *(uint *)((long)pvVar2 + 0x10370) & 0xfffff9ff | 0x400;
      }
    }
    break;
  case 'c':
    iVar4 = strcmp(key,"compression-level");
    if (iVar4 != 0) {
      iVar4 = strcmp(key,"copyright-file");
      if (iVar4 != 0) {
        return -0x14;
      }
      iVar4 = get_str_opt(a,(archive_string *)((long)pvVar2 + 0x188),0x25,key,value);
      uVar5 = (uint)(iVar4 == 0) << 0xc;
      uVar7 = 0xffffefff;
      goto LAB_004314e8;
    }
    if (((value == (char *)0x0) || (9 < (byte)(*value - 0x30U))) || (value[1] != '\0'))
    goto LAB_00431a2c;
    *(uint *)((long)pvVar2 + 0x2c8) = (uint)(byte)(*value - 0x30U);
    *(byte *)((long)pvVar2 + 0x10371) = *(byte *)((long)pvVar2 + 0x10371) | 8;
    goto LAB_00431909;
  case 'd':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
  case 'k':
  case 'm':
  case 'n':
  case 'o':
  case 'q':
  case 's':
  case 't':
  case 'u':
    goto switchD_004312f1_caseD_64;
  case 'i':
    iVar4 = strcmp(key,"iso-level");
    if (iVar4 != 0) {
      return -0x14;
    }
    if (((value == (char *)0x0) || (value[1] != '\0')) || (3 < (byte)(*value - 0x31U)))
    goto LAB_00431a2c;
    uVar7 = *(uint *)((long)pvVar2 + 0x10370) & 0xfffe3fff | ((byte)*value & 7) << 0xe;
    goto LAB_004317de;
  case 'j':
    iVar4 = strcmp(key,"joliet");
    if (iVar4 != 0) {
      return -0x14;
    }
    if (value == (char *)0x0) {
      *(byte *)((long)pvVar2 + 0x10372) = *(byte *)((long)pvVar2 + 0x10372) & 0xf9;
      goto LAB_00431909;
    }
    iVar4 = strcmp(value,"1");
    if (iVar4 == 0) {
      uVar5 = *(uint *)((long)pvVar2 + 0x10370) & 0xfff9ffff | 0x20000;
    }
    else {
      iVar4 = strcmp(value,"long");
      if (iVar4 != 0) goto LAB_00431a2c;
      uVar5 = *(uint *)((long)pvVar2 + 0x10370) & 0xfff9ffff | 0x40000;
    }
    break;
  case 'l':
    iVar4 = strcmp(key,"limit-depth");
    if (iVar4 == 0) {
      uVar7 = *(uint *)((long)pvVar2 + 0x10370) & 0xfff7ffff;
      uVar5 = (uint)(value != (char *)0x0) << 0x13;
    }
    else {
      iVar4 = strcmp(key,"limit-dirs");
      if (iVar4 != 0) {
        return -0x14;
      }
      uVar7 = *(uint *)((long)pvVar2 + 0x10370) & 0xffefffff;
      uVar5 = (uint)(value != (char *)0x0) << 0x14;
    }
    goto LAB_004317dc;
  case 'p':
    iVar4 = strcmp(key,"pad");
    if (iVar4 != 0) {
      iVar4 = strcmp(key,"publisher");
      if (iVar4 != 0) {
        return -0x14;
      }
      iVar4 = get_str_opt(a,(archive_string *)((long)pvVar2 + 0x140),0x80,key,value);
      uVar5 = (uint)(iVar4 == 0) << 0x16;
      uVar7 = 0xffbfffff;
      goto LAB_004314e8;
    }
    uVar7 = *(uint *)((long)pvVar2 + 0x10370) & 0xffdfffff;
    uVar5 = (uint)(value != (char *)0x0) << 0x15;
LAB_004317dc:
    uVar7 = uVar7 | uVar5;
LAB_004317de:
    *(uint *)((long)pvVar2 + 0x10370) = uVar7;
    goto LAB_00431909;
  case 'r':
    iVar4 = strcmp(key,"rockridge");
    if ((iVar4 != 0) && (iVar4 = strcmp(key,"Rockridge"), iVar4 != 0)) {
      return -0x14;
    }
    if (value == (char *)0x0) {
      *(uint *)((long)pvVar2 + 0x10370) = *(uint *)((long)pvVar2 + 0x10370) & 0xfe7fffff;
      goto LAB_00431909;
    }
    iVar4 = strcmp(value,"1");
    if (iVar4 != 0) {
      iVar4 = strcmp(value,"strict");
      if (iVar4 == 0) {
        uVar5 = *(uint *)((long)pvVar2 + 0x10370) & 0xfe7fffff | 0x800000;
        break;
      }
      iVar4 = strcmp(value,"useful");
      if (iVar4 != 0) goto LAB_00431a2c;
    }
    uVar5 = *(uint *)((long)pvVar2 + 0x10370) & 0xfe7fffff | 0x1000000;
    break;
  case 'v':
    iVar4 = strcmp(key,"volume-id");
    if (iVar4 != 0) {
      return -0x14;
    }
    iVar4 = get_str_opt(a,(archive_string *)((long)pvVar2 + 0x128),0x20,key,value);
    uVar5 = (uint)(iVar4 == 0) << 0x19;
    uVar7 = 0xfdffffff;
LAB_004314e8:
    uVar7 = uVar7 & *(uint *)((long)pvVar2 + 0x10370);
LAB_004318a6:
    *(uint *)((long)pvVar2 + 0x10370) = uVar7 | uVar5;
    return iVar4;
  default:
    if (*key != 'z') {
      return -0x14;
    }
    iVar4 = strcmp(key,"zisofs");
    if (iVar4 != 0) {
      return -0x14;
    }
    if (value == (char *)0x0) {
      uVar5 = *(uint *)((long)pvVar2 + 0x10370) & 0xfbffffff;
    }
    else {
      uVar5 = *(uint *)((long)pvVar2 + 0x10370) | 0x4000000;
    }
  }
  *(uint *)((long)pvVar2 + 0x10370) = uVar5;
LAB_00431909:
  iVar4 = 0;
switchD_004312f1_caseD_64:
  return iVar4;
}

Assistant:

static int
iso9660_options(struct archive_write *a, const char *key, const char *value)
{
	struct iso9660 *iso9660 = a->format_data;
	const char *p;
	int r;

	switch (key[0]) {
	case 'a':
		if (strcmp(key, "abstract-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->abstract_file_identifier),
			    ABSTRACT_FILE_SIZE, key, value);
			iso9660->opt.abstract_file = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "application-id") == 0) {
			r = get_str_opt(a,
			    &(iso9660->application_identifier),
			    APPLICATION_IDENTIFIER_SIZE, key, value);
			iso9660->opt.application_id = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "allow-vernum") == 0) {
			iso9660->opt.allow_vernum = value != NULL;
			return (ARCHIVE_OK);
		}
		break;
	case 'b':
		if (strcmp(key, "biblio-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->bibliographic_file_identifier),
			    BIBLIO_FILE_SIZE, key, value);
			iso9660->opt.biblio_file = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "boot") == 0) {
			if (value == NULL)
				iso9660->opt.boot = 0;
			else {
				iso9660->opt.boot = 1;
				archive_strcpy(
				    &(iso9660->el_torito.boot_filename),
				    value);
			}
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-catalog") == 0) {
			r = get_str_opt(a,
			    &(iso9660->el_torito.catalog_filename),
			    1024, key, value);
			iso9660->opt.boot_catalog = r == ARCHIVE_OK;
			return (r);
		}
		if (strcmp(key, "boot-info-table") == 0) {
			iso9660->opt.boot_info_table = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-load-seg") == 0) {
			uint32_t seg;

			iso9660->opt.boot_load_seg = 0;
			if (value == NULL)
				goto invalid_value;
			seg = 0;
			p = value;
			if (p[0] == '0' && (p[1] == 'x' || p[1] == 'X'))
				p += 2;
			while (*p) {
				if (seg)
					seg <<= 4;
				if (*p >= 'A' && *p <= 'F')
					seg += *p - 'A' + 0x0a;
				else if (*p >= 'a' && *p <= 'f')
					seg += *p - 'a' + 0x0a;
				else if (*p >= '0' && *p <= '9')
					seg += *p - '0';
				else
					goto invalid_value;
				if (seg > 0xffff) {
					archive_set_error(&a->archive,
					    ARCHIVE_ERRNO_MISC,
					    "Invalid value(over 0xffff) for "
					    "option ``%s''", key);
					return (ARCHIVE_FATAL);
				}
				p++;
			}
			iso9660->el_torito.boot_load_seg = (uint16_t)seg;
			iso9660->opt.boot_load_seg = 1;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-load-size") == 0) {
			int num = 0;
			r = get_num_opt(a, &num, 0xffff, 1, key, value);
			iso9660->opt.boot_load_size = r == ARCHIVE_OK;
			if (r != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->el_torito.boot_load_size = (uint16_t)num;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "boot-type") == 0) {
			if (value == NULL)
				goto invalid_value;
			if (strcmp(value, "no-emulation") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_NO_EMU;
			else if (strcmp(value, "fd") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_FD;
			else if (strcmp(value, "hard-disk") == 0)
				iso9660->opt.boot_type = OPT_BOOT_TYPE_HARD_DISK;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'c':
		if (strcmp(key, "compression-level") == 0) {
#ifdef HAVE_ZLIB_H
			if (value == NULL ||
			    !(value[0] >= '0' && value[0] <= '9') ||
			    value[1] != '\0')
				goto invalid_value;
                	iso9660->zisofs.compression_level = value[0] - '0';
			iso9660->opt.compression_level = 1;
                	return (ARCHIVE_OK);
#else
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_MISC,
			    "Option ``%s'' "
			    "is not supported on this platform.", key);
			return (ARCHIVE_FATAL);
#endif
		}
		if (strcmp(key, "copyright-file") == 0) {
			r = get_str_opt(a,
			    &(iso9660->copyright_file_identifier),
			    COPYRIGHT_FILE_SIZE, key, value);
			iso9660->opt.copyright_file = r == ARCHIVE_OK;
			return (r);
		}
#ifdef DEBUG
		/* Specifies Volume creation date and time;
		 * year(4),month(2),day(2),hour(2),minute(2),second(2).
		 * e.g. "20090929033757"
		 */
		if (strcmp(key, "creation") == 0) {
			struct tm tm;
			char buf[5];

			p = value;
			if (p == NULL || strlen(p) < 14)
				goto invalid_value;
			memset(&tm, 0, sizeof(tm));
			memcpy(buf, p, 4); buf[4] = '\0'; p += 4;
			tm.tm_year = strtol(buf, NULL, 10) - 1900;
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_mon = strtol(buf, NULL, 10) - 1;
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_mday = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_hour = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0'; p += 2;
			tm.tm_min = strtol(buf, NULL, 10);
			memcpy(buf, p, 2); buf[2] = '\0';
			tm.tm_sec = strtol(buf, NULL, 10);
			iso9660->birth_time = mktime(&tm);
			return (ARCHIVE_OK);
		}
#endif
		break;
	case 'i':
		if (strcmp(key, "iso-level") == 0) {
			if (value != NULL && value[1] == '\0' &&
			    (value[0] >= '1' && value[0] <= '4')) {
				iso9660->opt.iso_level = value[0]-'0';
				return (ARCHIVE_OK);
			}
			goto invalid_value;
		}
		break;
	case 'j':
		if (strcmp(key, "joliet") == 0) {
			if (value == NULL)
				iso9660->opt.joliet = OPT_JOLIET_DISABLE;
			else if (strcmp(value, "1") == 0)
				iso9660->opt.joliet = OPT_JOLIET_ENABLE;
			else if (strcmp(value, "long") == 0)
				iso9660->opt.joliet = OPT_JOLIET_LONGNAME;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'l':
		if (strcmp(key, "limit-depth") == 0) {
			iso9660->opt.limit_depth = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "limit-dirs") == 0) {
			iso9660->opt.limit_dirs = value != NULL;
			return (ARCHIVE_OK);
		}
		break;
	case 'p':
		if (strcmp(key, "pad") == 0) {
			iso9660->opt.pad = value != NULL;
			return (ARCHIVE_OK);
		}
		if (strcmp(key, "publisher") == 0) {
			r = get_str_opt(a,
			    &(iso9660->publisher_identifier),
			    PUBLISHER_IDENTIFIER_SIZE, key, value);
			iso9660->opt.publisher = r == ARCHIVE_OK;
			return (r);
		}
		break;
	case 'r':
		if (strcmp(key, "rockridge") == 0 ||
		    strcmp(key, "Rockridge") == 0) {
			if (value == NULL)
				iso9660->opt.rr = OPT_RR_DISABLED;
			else if (strcmp(value, "1") == 0)
				iso9660->opt.rr = OPT_RR_USEFUL;
			else if (strcmp(value, "strict") == 0)
				iso9660->opt.rr = OPT_RR_STRICT;
			else if (strcmp(value, "useful") == 0)
				iso9660->opt.rr = OPT_RR_USEFUL;
			else
				goto invalid_value;
			return (ARCHIVE_OK);
		}
		break;
	case 'v':
		if (strcmp(key, "volume-id") == 0) {
			r = get_str_opt(a, &(iso9660->volume_identifier),
			    VOLUME_IDENTIFIER_SIZE, key, value);
			iso9660->opt.volume_id = r == ARCHIVE_OK;
			return (r);
		}
		break;
	case 'z':
		if (strcmp(key, "zisofs") == 0) {
			if (value == NULL)
				iso9660->opt.zisofs = OPT_ZISOFS_DISABLED;
			else {
#ifdef HAVE_ZLIB_H
				iso9660->opt.zisofs = OPT_ZISOFS_DIRECT;
#else
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "``zisofs'' "
				    "is not supported on this platform.");
				return (ARCHIVE_FATAL);
#endif
			}
			return (ARCHIVE_OK);
		}
		break;
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);

invalid_value:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
	    "Invalid value for option ``%s''", key);
	return (ARCHIVE_FAILED);
}